

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_HatchLine>::Append(ON_ClassArray<ON_HatchLine> *this,int count,ON_HatchLine *p)

{
  ON_HatchLine *pOVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  double *pdVar6;
  uint uVar7;
  ON_SimpleArray<double> *src;
  uint uVar8;
  ulong uVar9;
  
  if (p != (ON_HatchLine *)0x0 && 0 < count) {
    uVar2 = this->m_count;
    uVar7 = uVar2 + count;
    if (this->m_capacity < (int)uVar7) {
      if ((int)uVar2 < 8 || (ulong)((long)(int)uVar2 << 6) < 0x10000001) {
        uVar8 = 4;
        if (2 < (int)uVar2) {
          uVar8 = uVar2 * 2;
        }
      }
      else {
        uVar8 = 0x400008;
        if (uVar2 < 0x400008) {
          uVar8 = uVar2;
        }
        uVar8 = uVar8 + uVar2;
      }
      if ((int)uVar7 < (int)uVar8) {
        uVar7 = uVar8;
      }
      if ((uint)this->m_capacity < uVar7) {
        SetCapacity(this,(long)(int)uVar7);
      }
    }
    uVar9 = (ulong)(uint)count;
    src = &p->m_dashes;
    do {
      iVar3 = this->m_count;
      this->m_count = iVar3 + 1;
      pOVar1 = this->m_a + iVar3;
      (pOVar1->m_offset).y = *(double *)&src[-1].m_count;
      pdVar4 = src[-2].m_a;
      dVar5 = *(double *)&src[-2].m_count;
      pdVar6 = src[-1].m_a;
      (pOVar1->m_base).y = (double)src[-1]._vptr_ON_SimpleArray;
      (pOVar1->m_offset).x = (double)pdVar6;
      pOVar1->m_angle_radians = (double)pdVar4;
      (pOVar1->m_base).x = dVar5;
      ON_SimpleArray<double>::operator=(&pOVar1->m_dashes,src);
      src = (ON_SimpleArray<double> *)&src[2].m_count;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}